

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::DefaultPrintTo<std::vector<int,std::allocator<int>>>
               (undefined8 param_1,vector<int,_std::allocator<int>_> *param_2,ostream *param_3)

{
  bool bVar1;
  reference value;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  const_iterator end;
  const_iterator it;
  size_t count;
  size_t kMaxCount;
  iu_ostream *os_local;
  vector<int,_std::allocator<int>_> *container_local;
  yes_t param_0_local;
  
  it._M_current = (int *)0x0;
  std::operator<<(param_3,"{");
  end = std::vector<int,_std::allocator<int>_>::begin(param_2);
  local_40._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(param_2);
  do {
    bVar1 = __gnu_cxx::operator!=(&end,&local_40);
    if (!bVar1) {
LAB_0015df41:
      if (it._M_current != (int *)0x0) {
        std::operator<<(param_3," ");
      }
      std::operator<<(param_3,"}");
      return;
    }
    if ((it._M_current != (int *)0x0) &&
       (std::operator<<(param_3,","), it._M_current == (int *)0x20)) {
      std::operator<<(param_3," ...");
      goto LAB_0015df41;
    }
    std::operator<<(param_3," ");
    value = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
            operator*(&end);
    UniversalPrint<int>(value,param_3);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&end);
    it._M_current = it._M_current + 1;
  } while( true );
}

Assistant:

inline void DefaultPrintTo(IsContainerHelper::yes_t
                        , iutest_type_traits::false_type
                        , const T& container, iu_ostream* os)
{
    const size_t kMaxCount = kValues::MaxPrintContainerCount;
    size_t count = 0;
    *os << "{";
    for( typename T::const_iterator it=container.begin(), end=container.end(); it != end; ++it, ++count)
    {
        if( count > 0 )
        {
            *os << ",";
            if( count == kMaxCount )
            {
                *os << " ...";
                break;
            }
        }
        *os << " ";
        UniversalPrint(*it, os);
    }
    if( count > 0 )
    {
        *os << " ";
    }
    *os << "}";
}